

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::updateSubtreeHeaders
          (cbtQuantizedBvh *this,int leftChildNodexIndex,int rightChildNodexIndex)

{
  cbtQuantizedBvhNode *pcVar1;
  cbtBvhSubtreeInfo *pcVar2;
  uint uVar3;
  uint uVar4;
  cbtBvhSubtreeInfo local_50;
  
  pcVar1 = (this->m_quantizedContiguousNodes).m_data;
  uVar3 = -pcVar1[leftChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pcVar1[leftChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar3 = 1;
  }
  uVar4 = -pcVar1[rightChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pcVar1[rightChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar4 = 1;
  }
  if (uVar3 < 0x81) {
    pcVar2 = cbtAlignedObjectArray<cbtBvhSubtreeInfo>::expand(&this->m_SubtreeHeaders,&local_50);
    cbtBvhSubtreeInfo::setAabbFromQuantizeNode(pcVar2,pcVar1 + leftChildNodexIndex);
    pcVar2->m_rootNodeIndex = leftChildNodexIndex;
    pcVar2->m_subtreeSize = uVar3;
  }
  if (uVar4 < 0x81) {
    pcVar2 = cbtAlignedObjectArray<cbtBvhSubtreeInfo>::expand(&this->m_SubtreeHeaders,&local_50);
    cbtBvhSubtreeInfo::setAabbFromQuantizeNode(pcVar2,pcVar1 + rightChildNodexIndex);
    pcVar2->m_rootNodeIndex = rightChildNodexIndex;
    pcVar2->m_subtreeSize = uVar4;
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  return;
}

Assistant:

void cbtQuantizedBvh::updateSubtreeHeaders(int leftChildNodexIndex, int rightChildNodexIndex)
{
	cbtAssert(m_useQuantization);

	cbtQuantizedBvhNode& leftChildNode = m_quantizedContiguousNodes[leftChildNodexIndex];
	int leftSubTreeSize = leftChildNode.isLeafNode() ? 1 : leftChildNode.getEscapeIndex();
	int leftSubTreeSizeInBytes = leftSubTreeSize * static_cast<int>(sizeof(cbtQuantizedBvhNode));

	cbtQuantizedBvhNode& rightChildNode = m_quantizedContiguousNodes[rightChildNodexIndex];
	int rightSubTreeSize = rightChildNode.isLeafNode() ? 1 : rightChildNode.getEscapeIndex();
	int rightSubTreeSizeInBytes = rightSubTreeSize * static_cast<int>(sizeof(cbtQuantizedBvhNode));

	if (leftSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(leftChildNode);
		subtree.m_rootNodeIndex = leftChildNodexIndex;
		subtree.m_subtreeSize = leftSubTreeSize;
	}

	if (rightSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(rightChildNode);
		subtree.m_rootNodeIndex = rightChildNodexIndex;
		subtree.m_subtreeSize = rightSubTreeSize;
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();
}